

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O2

char * mbedtls_ssl_get_ciphersuite_name(int ciphersuite_id)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  char *pcVar2;
  
  pmVar1 = mbedtls_ssl_ciphersuite_from_id(ciphersuite_id);
  if (pmVar1 == (mbedtls_ssl_ciphersuite_t *)0x0) {
    pcVar2 = "unknown";
  }
  else {
    pcVar2 = pmVar1->name;
  }
  return pcVar2;
}

Assistant:

const char *mbedtls_ssl_get_ciphersuite_name(const int ciphersuite_id)
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_id(ciphersuite_id);

    if (cur == NULL) {
        return "unknown";
    }

    return cur->name;
}